

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O1

void rapidjson::internal::Grisu2(double value,char *buffer,int *length,int *K)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  DiyFp DVar5;
  DiyFp w_p;
  DiyFp w_m;
  DiyFp local_90;
  DiyFp local_80;
  DiyFp local_70;
  DiyFp local_60;
  DiyFp local_50;
  DiyFp local_40;
  
  local_90.f = (ulong)value & 0xfffffffffffff;
  if (((ulong)value >> 0x34 & 0x7ff) == 0) {
    local_90.e = -0x432;
  }
  else {
    local_90.f = local_90.f + 0x10000000000000;
    local_90.e = ((uint)((ulong)value >> 0x34) & 0x7ff) - 0x433;
  }
  local_60.f = 0;
  local_60.e = 0;
  local_70.f = 0;
  local_70.e = 0;
  DiyFp::NormalizedBoundaries(&local_90,&local_60,&local_70);
  dVar2 = (double)(-0x3d - local_70.e) * 0.30102999566398114 + 347.0;
  iVar4 = (int)((uint)((double)(int)dVar2 < dVar2) + (int)dVar2) >> 3;
  uVar3 = iVar4 + 1;
  *K = 0x15c - (iVar4 * 8 + 8);
  if (uVar3 < 0x57) {
    local_40.f = *(uint64_t *)
                  (GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + (ulong)uVar3 * 8);
    local_40.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E +
                                (ulong)uVar3 * 2);
    DVar5 = DiyFp::Normalize(&local_90);
    local_80.f = DVar5.f;
    local_80.e = DVar5.e;
    DVar5 = DiyFp::operator*(&local_80,&local_40);
    local_50.f = DVar5.f;
    local_50.e = DVar5.e;
    DVar5 = DiyFp::operator*(&local_70,&local_40);
    local_80.f = DVar5.f;
    local_80.e = DVar5.e;
    DVar5 = DiyFp::operator*(&local_60,&local_40);
    lVar1 = local_80.f - 1;
    local_80.f = local_80.f - 1;
    DigitGen(&local_50,&local_80,lVar1 + ~DVar5.f,buffer,length,K);
    return;
  }
  __assert_fail("index < 87",
                "/workspace/llm4binary/github/license_all_cmakelists_25/j05070415[P]RJson/rapidjson/include/rapidjson/internal/diyfp.h"
                ,0xdc,"DiyFp rapidjson::internal::GetCachedPowerByIndex(size_t)");
}

Assistant:

inline void Grisu2(double value, char* buffer, int* length, int* K) {
    const DiyFp v(value);
    DiyFp w_m, w_p;
    v.NormalizedBoundaries(&w_m, &w_p);

    const DiyFp c_mk = GetCachedPower(w_p.e, K);
    const DiyFp W = v.Normalize() * c_mk;
    DiyFp Wp = w_p * c_mk;
    DiyFp Wm = w_m * c_mk;
    Wm.f++;
    Wp.f--;
    DigitGen(W, Wp, Wp.f - Wm.f, buffer, length, K);
}